

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  puts("test_C2S_REQUEST ------------------------->");
  test_C2S_REQUEST();
  test_C2S_REQUEST_check();
  puts("\n\n");
  puts("test_S2C_RESPONSE ------------------------->");
  test_S2C_RESPONSE();
  test_S2C_RESPONSE_check();
  puts("\n\n");
  puts("test_SEND_TCP_DATA ------------------------->");
  test_SEND_TCP_DATA();
  test_SEND_TCP_DATA_check();
  puts("\n\n");
  puts("test_C2S_UDP_DATA ------------------------->");
  test_C2S_UDP_DATA();
  test_C2S_UDP_DATA_check();
  net_uv::printMemInfo();
  return 0;
}

Assistant:

int main()
{
	printf("test_C2S_REQUEST ------------------------->\n");
	test_C2S_REQUEST();
	test_C2S_REQUEST_check();
	
	printf("\n\n\n");
	printf("test_S2C_RESPONSE ------------------------->\n");
	test_S2C_RESPONSE();
	test_S2C_RESPONSE_check();
	
	printf("\n\n\n");
	printf("test_SEND_TCP_DATA ------------------------->\n");
	test_SEND_TCP_DATA();
	test_SEND_TCP_DATA_check();
	
	printf("\n\n\n");
	printf("test_C2S_UDP_DATA ------------------------->\n");
	test_C2S_UDP_DATA();
	test_C2S_UDP_DATA_check();	
	
	printMemInfo();
	//system("pause");

	return 0;
}